

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O2

void __thiscall
flow::AllocaInstr::AllocaInstr(AllocaInstr *this,LiteralType ty,Value *n,string *name)

{
  initializer_list<flow::Value_*> __l;
  allocator_type local_41;
  Value *local_40;
  _Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_> local_38;
  
  __l._M_len = 1;
  __l._M_array = &local_40;
  local_40 = n;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector
            ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_38,__l,&local_41);
  Instr::Instr(&this->super_Instr,ty,
               (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_38,name);
  std::_Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>::~_Vector_base(&local_38);
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__Instr_001b04a0;
  return;
}

Assistant:

AllocaInstr(LiteralType ty, Value* n, const std::string& name)
      : Instr(ty, {n}, name) {}